

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkTiming.c
# Opt level: O3

int Nwk_ManVerifyTiming(Nwk_Man_t *pNtk)

{
  float fVar1;
  Nwk_Obj_t *pObj;
  Vec_Ptr_t *pVVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  
  pVVar2 = pNtk->vObjs;
  if (0 < pVVar2->nSize) {
    lVar3 = 0;
    do {
      pObj = (Nwk_Obj_t *)pVVar2->pArray[lVar3];
      if ((pObj != (Nwk_Obj_t *)0x0) &&
         (((*(uint *)&pObj->field_0x20 & 7) != 1 || (pObj->nFanouts != 0)))) {
        fVar4 = Nwk_NodeComputeArrival(pObj,1);
        fVar5 = Nwk_NodeComputeRequired(pObj,1);
        fVar1 = pObj->tArrival;
        if ((fVar4 + 0.01 <= fVar1) || (fVar1 + 0.01 <= fVar4)) {
          printf("Nwk_ManVerifyTiming(): Object %d has different arrival time (%.2f) from computed (%.2f).\n"
                 ,(double)fVar1,(double)fVar4,(ulong)(uint)pObj->Id);
        }
        fVar1 = pObj->tRequired;
        if ((fVar5 + 0.01 <= fVar1) || (fVar1 + 0.01 <= fVar5)) {
          printf("Nwk_ManVerifyTiming(): Object %d has different required time (%.2f) from computed (%.2f).\n"
                 ,(double)fVar1,(double)fVar5,(ulong)(uint)pObj->Id);
        }
      }
      lVar3 = lVar3 + 1;
      pVVar2 = pNtk->vObjs;
    } while (lVar3 < pVVar2->nSize);
  }
  return 1;
}

Assistant:

int Nwk_ManVerifyTiming(  Nwk_Man_t * pNtk )
{
    Nwk_Obj_t * pObj;
    float tArrival, tRequired;
    int i;
    Nwk_ManForEachObj( pNtk, pObj, i )
    {
        if ( Nwk_ObjIsCi(pObj) && Nwk_ObjFanoutNum(pObj) == 0 )
            continue;
        tArrival = Nwk_NodeComputeArrival( pObj, 1 );
        tRequired = Nwk_NodeComputeRequired( pObj, 1 );
        if ( !Nwk_ManTimeEqual( tArrival, Nwk_ObjArrival(pObj), (float)0.01 ) )
            printf( "Nwk_ManVerifyTiming(): Object %d has different arrival time (%.2f) from computed (%.2f).\n", 
                pObj->Id, Nwk_ObjArrival(pObj), tArrival );
        if ( !Nwk_ManTimeEqual( tRequired, Nwk_ObjRequired(pObj), (float)0.01 ) )
            printf( "Nwk_ManVerifyTiming(): Object %d has different required time (%.2f) from computed (%.2f).\n", 
                pObj->Id, Nwk_ObjRequired(pObj), tRequired );
    }
    return 1;
}